

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O0

DOMXPathResult * __thiscall
xercesc_4_0::DOMXPathExpressionImpl::evaluate
          (DOMXPathExpressionImpl *this,DOMNode *contextNode,ResultType type,DOMXPathResult *result)

{
  int iVar1;
  DOMXPathException *this_00;
  DOMException *pDVar2;
  undefined4 extraout_var;
  XMLCh *rawName;
  undefined4 extraout_var_00;
  long *local_1e8;
  DOMElement *local_1b0;
  DOMNode *child;
  RefVectorOf<xercesc_4_0::XMLAttr> attrList;
  SchemaElementDecl elemDecl;
  QName qName;
  XPathMatcher matcher;
  DOMXPathResultImpl *r;
  undefined1 local_50 [8];
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> r_cleanup;
  DOMXPathResult *result_local;
  ResultType type_local;
  DOMNode *contextNode_local;
  DOMXPathExpressionImpl *this_local;
  
  if ((((type != FIRST_ORDERED_NODE_TYPE) && (type != ORDERED_NODE_SNAPSHOT_TYPE)) &&
      (type != ANY_UNORDERED_NODE_TYPE)) && (type != UNORDERED_NODE_SNAPSHOT_TYPE)) {
    this_00 = (DOMXPathException *)__cxa_allocate_exception(0x28);
    DOMXPathException::DOMXPathException(this_00,0x34,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMXPathException::typeinfo,DOMXPathException::~DOMXPathException);
  }
  if (contextNode != (DOMNode *)0x0) {
    iVar1 = (*contextNode->_vptr_DOMNode[4])();
    if (iVar1 == 1) {
      JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::JanitorMemFunCall
                ((JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> *)local_50,
                 (DOMXPathResultImpl *)0x0,0x71);
      if (result == (DOMXPathResult *)0x0) {
        matcher.fMemoryManager = (MemoryManager *)XMemory::operator_new(0x28,this->fMemoryManager);
        DOMXPathResultImpl::DOMXPathResultImpl
                  ((DOMXPathResultImpl *)matcher.fMemoryManager,type,this->fMemoryManager);
        JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::reset
                  ((JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> *)local_50,
                   (DOMXPathResultImpl *)matcher.fMemoryManager);
      }
      else {
        DOMXPathResultImpl::reset((DOMXPathResultImpl *)result,type);
        matcher.fMemoryManager = (MemoryManager *)result;
      }
      XPathMatcher::XPathMatcher
                ((XPathMatcher *)&qName.fMemoryManager,this->fParsedExpression,this->fMemoryManager)
      ;
      XPathMatcher::startDocumentFragment((XPathMatcher *)&qName.fMemoryManager);
      if ((this->fMoveToRoot & 1U) == 0) {
        testNode(this,(XPathMatcher *)&qName.fMemoryManager,
                 (DOMXPathResultImpl *)matcher.fMemoryManager,(DOMElement *)contextNode);
      }
      else {
        iVar1 = (*contextNode->_vptr_DOMNode[0xc])();
        local_1e8 = (long *)0x0;
        if (CONCAT44(extraout_var,iVar1) != 0) {
          local_1e8 = (long *)(CONCAT44(extraout_var,iVar1) + 0x18);
        }
        if (local_1e8 == (long *)0x0) {
          pDVar2 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(pDVar2,9,0,this->fMemoryManager);
          __cxa_throw(pDVar2,&DOMException::typeinfo,DOMException::~DOMException);
        }
        rawName = (XMLCh *)(**(code **)(*local_1e8 + 0x10))();
        QName::QName((QName *)&elemDecl.fDatatypeValidator,rawName,0,this->fMemoryManager);
        SchemaElementDecl::SchemaElementDecl
                  ((SchemaElementDecl *)
                   &attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,
                   (QName *)&elemDecl.fDatatypeValidator,Any,0xfffffffe,
                   XMLPlatformUtils::fgMemoryManager);
        RefVectorOf<xercesc_4_0::XMLAttr>::RefVectorOf
                  ((RefVectorOf<xercesc_4_0::XMLAttr> *)&child,0,true,this->fMemoryManager);
        XPathMatcher::startElement
                  ((XPathMatcher *)&qName.fMemoryManager,
                   (XMLElementDecl *)
                   &attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,0,L"",
                   (RefVectorOf<xercesc_4_0::XMLAttr> *)&child,0,(ValidationContext *)0x0);
        local_1b0 = (DOMElement *)(**(code **)(*local_1e8 + 0x38))();
        while (local_1b0 != (DOMElement *)0x0) {
          iVar1 = (*(local_1b0->super_DOMNode)._vptr_DOMNode[4])();
          if (iVar1 == 1) {
            testNode(this,(XPathMatcher *)&qName.fMemoryManager,
                     (DOMXPathResultImpl *)matcher.fMemoryManager,local_1b0);
          }
          iVar1 = (*(local_1b0->super_DOMNode)._vptr_DOMNode[10])();
          local_1b0 = (DOMElement *)CONCAT44(extraout_var_00,iVar1);
        }
        XPathMatcher::endElement
                  ((XPathMatcher *)&qName.fMemoryManager,
                   (XMLElementDecl *)
                   &attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,L"",
                   (ValidationContext *)0x0,(DatatypeValidator *)0x0);
        RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf((RefVectorOf<xercesc_4_0::XMLAttr> *)&child)
        ;
        SchemaElementDecl::~SchemaElementDecl
                  ((SchemaElementDecl *)
                   &attrList.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager);
        QName::~QName((QName *)&elemDecl.fDatatypeValidator);
      }
      JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::release
                ((JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> *)local_50);
      XPathMatcher::~XPathMatcher((XPathMatcher *)&qName.fMemoryManager);
      JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::~JanitorMemFunCall
                ((JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> *)local_50);
      return (DOMXPathResult *)matcher.fMemoryManager;
    }
  }
  pDVar2 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(pDVar2,9,0,this->fMemoryManager);
  __cxa_throw(pDVar2,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMXPathResult* DOMXPathExpressionImpl::evaluate(const DOMNode *contextNode,
                                                 DOMXPathResult::ResultType type,
                                                 DOMXPathResult* result) const
{
    if(type!=DOMXPathResult::FIRST_ORDERED_NODE_TYPE && type!=DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE &&
       type!=DOMXPathResult::ANY_UNORDERED_NODE_TYPE && type!=DOMXPathResult::UNORDERED_NODE_SNAPSHOT_TYPE)
        throw DOMXPathException(DOMXPathException::TYPE_ERR, 0, fMemoryManager);

    if(contextNode==NULL || contextNode->getNodeType()!=DOMNode::ELEMENT_NODE)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    JanitorMemFunCall<DOMXPathResultImpl> r_cleanup (
      0, &DOMXPathResultImpl::release);
    DOMXPathResultImpl* r=(DOMXPathResultImpl*)result;
    if(r==NULL)
    {
      r=new (fMemoryManager) DOMXPathResultImpl(type, fMemoryManager);
      r_cleanup.reset (r);
    }
    else
        r->reset(type);

    XPathMatcher matcher(fParsedExpression, fMemoryManager);
    matcher.startDocumentFragment();

    if(fMoveToRoot)
    {
        contextNode=contextNode->getOwnerDocument();
        if(contextNode==NULL)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

        QName qName(contextNode->getNodeName(), 0, fMemoryManager);
        SchemaElementDecl elemDecl(&qName);
        RefVectorOf<XMLAttr> attrList(0, true, fMemoryManager);
        matcher.startElement(elemDecl, 0, XMLUni::fgZeroLenString, attrList, 0);
        DOMNode* child=contextNode->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                testNode(&matcher, r, (DOMElement*)child);
            child=child->getNextSibling();
        }
        matcher.endElement(elemDecl, XMLUni::fgZeroLenString);
    }
    else
        testNode(&matcher, r, (DOMElement*)contextNode);

    r_cleanup.release ();
    return r;
}